

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

void __thiscall
doublechecked::Roaring64Map::removeRange(Roaring64Map *this,uint64_t min,uint64_t max)

{
  _Base_ptr p_Var1;
  _Base_ptr *pp_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  const_iterator __last;
  const_iterator __first;
  
  if (max <= min) {
    return;
  }
  roaring::Roaring64Map::removeRangeClosed(&this->plain,min,max - 1);
  p_Var3 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __last._M_node = &(this->check)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = p_Var3;
  __first._M_node = __last._M_node;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      p_Var1 = p_Var4 + 1;
      if (*(ulong *)p_Var1 >= min) {
        __first._M_node = p_Var4;
      }
      pp_Var2 = &p_Var4->_M_left;
      p_Var4 = pp_Var2[*(ulong *)p_Var1 < min];
    } while (pp_Var2[*(ulong *)p_Var1 < min] != (_Base_ptr)0x0);
    do {
      if (*(ulong *)(p_Var3 + 1) >= max) {
        __last._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < max];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_erase_aux(&(this->check)._M_t,__first,__last);
  return;
}

Assistant:

void removeRange(uint64_t min, uint64_t max) {
        if (min >= max) {
            return;
        }
        return removeRangeClosed(min, max - 1);
    }